

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrBodyJointLocationFB *value)

{
  XrResult XVar1;
  XrResult XVar2;
  undefined7 in_register_00000009;
  uint32_t in_stack_fffffffffffffdec;
  string local_210;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  string local_1c0;
  ostringstream oss_enum;
  
  XVar1 = XR_SUCCESS;
  if ((int)CONCAT71(in_register_00000009,check_members) != 0) {
    XVar1 = XR_SUCCESS;
    XVar2 = (uint)(value->locationFlags < 0x10) + XR_TIMEOUT_EXPIRED;
    if (value->locationFlags == 0) {
      XVar2 = XVar1;
    }
    if (XVar2 != ~XR_ERROR_OUT_OF_MEMORY) {
      if (XVar2 == XR_SUCCESS) {
        std::__cxx11::string::string
                  ((string *)&oss_enum,"VUID-XrBodyJointLocationFB-locationFlags-requiredbitmask",
                   (allocator *)&local_1c0);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_1d8,objects_info);
        std::__cxx11::string::string
                  ((string *)&local_210,
                   "XrSpaceLocationFlags \"locationFlags\" flag must be non-zero",
                   (allocator *)&stack0xfffffffffffffdef);
        CoreValidLogMessage(instance_info,(string *)&oss_enum,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_1d8,&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(&local_1d8);
        std::__cxx11::string::~string((string *)&oss_enum);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_enum);
        std::operator<<((ostream *)&oss_enum,
                        "XrBodyJointLocationFB invalid member XrSpaceLocationFlags \"locationFlags\" flag value "
                       );
        Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffdec);
        std::operator<<((ostream *)&oss_enum,(string *)&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        std::operator<<((ostream *)&oss_enum," contains illegal bit");
        std::__cxx11::string::string
                  ((string *)&local_210,"VUID-XrBodyJointLocationFB-locationFlags-parameter",
                   (allocator *)&stack0xfffffffffffffdef);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_1f0,objects_info);
        std::__cxx11::stringbuf::str();
        CoreValidLogMessage(instance_info,&local_210,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_1f0,&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(&local_1f0);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_enum);
      }
      XVar1 = XR_ERROR_VALIDATION_FAILURE;
    }
  }
  return XVar1;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrBodyJointLocationFB* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    ValidateXrFlagsResult space_location_flags_result = ValidateXrSpaceLocationFlags(value->locationFlags);
    // Flags must be non-zero in this case.
    if (VALIDATE_XR_FLAGS_ZERO == space_location_flags_result) {
        CoreValidLogMessage(instance_info, "VUID-XrBodyJointLocationFB-locationFlags-requiredbitmask",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, "XrSpaceLocationFlags \"locationFlags\" flag must be non-zero");
        return XR_ERROR_VALIDATION_FAILURE;
    } else if (VALIDATE_XR_FLAGS_SUCCESS != space_location_flags_result) {
        // Otherwise, flags must be valid.
        std::ostringstream oss_enum;
        oss_enum << "XrBodyJointLocationFB invalid member XrSpaceLocationFlags \"locationFlags\" flag value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->locationFlags));
        oss_enum <<" contains illegal bit";
        CoreValidLogMessage(instance_info, "VUID-XrBodyJointLocationFB-locationFlags-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}